

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall
wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented::addAssertsInNonInstrumented(wasm::
Function*)::Walker::handleCall(wasm::Expression__(void *this,Expression *call)

{
  undefined4 uVar1;
  uintptr_t uVar2;
  long lVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 *puVar7;
  Index index;
  Expression *pEVar8;
  Expression *pEVar9;
  Binary *this_00;
  If *this_01;
  Block *pBVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  ulong extraout_RDX;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Type in_R8;
  long *plVar16;
  long *plVar17;
  __hash_code __code;
  optional<wasm::Type> type;
  optional<wasm::Type> type_;
  optional<wasm::Type> type_00;
  initializer_list<wasm::Expression_*> local_70;
  Block *local_60;
  If *local_58;
  undefined1 *local_50;
  Expression *local_48;
  Builder *local_40;
  undefined8 *local_38;
  
  uVar2 = DAT_010d1bc8;
  uVar6 = ASYNCIFY_STATE;
  plVar16 = *(long **)((long)this + 0xe0);
  local_48 = call;
  pEVar8 = (Expression *)MixedArena::allocSpace((MixedArena *)(*plVar16 + 0x200),0x20,8);
  pEVar8->_id = GlobalGetId;
  (pEVar8->type).id = 0;
  *(undefined8 *)(pEVar8 + 1) = 0;
  *(undefined8 *)(pEVar8 + 1) = uVar6;
  pEVar8[1].type.id = uVar2;
  (pEVar8->type).id = 2;
  uVar1 = *(undefined4 *)((long)this + 0xe8);
  pEVar9 = (Expression *)
           MixedArena::allocSpace((MixedArena *)(**(long **)((long)this + 0xe0) + 0x200),0x18,8);
  pEVar9->_id = LocalGetId;
  *(undefined4 *)(pEVar9 + 1) = uVar1;
  (pEVar9->type).id = 2;
  this_00 = (Binary *)MixedArena::allocSpace((MixedArena *)(*plVar16 + 0x200),0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = NeInt32;
  this_00->left = pEVar8;
  this_00->right = pEVar9;
  Binary::finalize(this_00);
  local_38 = (undefined8 *)this;
  pEVar9 = (Expression *)
           MixedArena::allocSpace((MixedArena *)(**(long **)((long)this + 0xe0) + 0x200),0x10,8);
  pEVar9->_id = UnreachableId;
  (pEVar9->type).id = 1;
  uVar15 = 0x28;
  this_01 = (If *)MixedArena::allocSpace((MixedArena *)(*plVar16 + 0x200),0x28,8);
  pEVar8 = local_48;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_01->ifFalse = (Expression *)0x0;
  this_01->condition = (Expression *)this_00;
  this_01->ifTrue = pEVar9;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
  If::finalize(this_01,type_);
  puVar7 = local_38;
  uVar15 = (pEVar8->type).id;
  if (uVar15 < 2) {
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
    pBVar10 = Builder::makeSequence((Builder *)local_38[0x1c],pEVar8,(Expression *)this_01,type_00);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar15;
    index = Builder::addVar((Builder *)local_38[0x1b],(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    local_40 = (Builder *)puVar7[0x1c];
    local_60 = (Block *)Builder::makeLocalSet(local_40,index,pEVar8);
    uVar2 = (pEVar8->type).id;
    local_58 = this_01;
    local_50 = (undefined1 *)
               MixedArena::allocSpace((MixedArena *)(*(long *)puVar7[0x1c] + 0x200),0x18,8);
    *local_50 = 8;
    *(Index *)(local_50 + 0x10) = index;
    *(uintptr_t *)(local_50 + 8) = uVar2;
    local_70._M_len = 3;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_70._M_array = (iterator)&local_60;
    pBVar10 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                        (local_40,&local_70,type);
  }
  lVar3 = puVar7[0x19];
  if ((lVar3 != 0) && (uVar15 = *(ulong *)*puVar7, *(long *)(lVar3 + 0xf0) != 0)) {
    local_60 = pBVar10;
    sVar11 = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(lVar3 + 0xd8),(key_type *)&local_60);
    if (sVar11 == 0) {
      uVar13 = uVar15 % *(ulong *)(lVar3 + 0xe0);
      plVar16 = *(long **)(*(long *)(lVar3 + 0xd8) + uVar13 * 8);
      plVar17 = (long *)0x0;
      if ((plVar16 != (long *)0x0) &&
         (plVar4 = (long *)*plVar16, plVar17 = plVar16, ((long *)*plVar16)[1] != uVar15)) {
        while (plVar16 = plVar4, plVar4 = (long *)*plVar16, plVar4 != (long *)0x0) {
          plVar17 = (long *)0x0;
          if (((ulong)plVar4[1] % *(ulong *)(lVar3 + 0xe0) != uVar13) ||
             (plVar17 = plVar16, plVar4[1] == uVar15)) goto LAB_007c0772;
        }
        plVar17 = (long *)0x0;
      }
LAB_007c0772:
      if (plVar17 == (long *)0x0) {
        lVar14 = 0;
      }
      else {
        lVar14 = *plVar17;
      }
      if (lVar14 != 0) {
        pmVar12 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)(lVar3 + 0xd8),(key_type *)&local_60);
        uVar6 = *(undefined8 *)(lVar14 + 0x18);
        *(undefined8 *)
         &(pmVar12->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)(lVar14 + 0x10);
        *(undefined8 *)
         ((long)&(pmVar12->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = uVar6;
        *(undefined8 *)
         ((long)&(pmVar12->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = *(undefined8 *)(lVar14 + 0x20);
      }
    }
  }
  *(Block **)*puVar7 = pBVar10;
  return;
}

Assistant:

void handleCall(Expression* call) {
        auto* check = builder->makeIf(
          builder->makeBinary(NeInt32,
                              builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                              builder->makeLocalGet(oldState, Type::i32)),
          builder->makeUnreachable());
        Expression* rep;
        if (call->type.isConcrete()) {
          auto temp = builder->addVar(func, call->type);
          rep = builder->makeBlock({
            builder->makeLocalSet(temp, call),
            check,
            builder->makeLocalGet(temp, call->type),
          });
        } else {
          rep = builder->makeSequence(call, check);
        }
        replaceCurrent(rep);
      }